

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_lambda_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundLambdaExpression::Copy(BoundLambdaExpression *this)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  pointer pEVar2;
  pointer pBVar3;
  long in_RSI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_40;
  _Tuple_impl<0UL,_duckdb::BoundLambdaExpression_*,_std::default_delete<duckdb::BoundLambdaExpression>_>
  local_38;
  
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)(in_RSI + 0x58));
  (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_40,pEVar2);
  make_uniq<duckdb::BoundLambdaExpression,duckdb::ExpressionType_const&,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,unsigned_long_const&>
            ((duckdb *)&local_38,(ExpressionType *)(in_RSI + 8),(LogicalType *)(in_RSI + 0x38),
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_40,(unsigned_long *)(in_RSI + 0x78));
  if (local_40._M_head_impl != (Expression *)0x0) {
    (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  puVar1 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
            (in_RSI + 0x68);
  for (this_00 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
                  (in_RSI + 0x60); this_00 != puVar1; this_00 = this_00 + 1) {
    pBVar3 = unique_ptr<duckdb::BoundLambdaExpression,_std::default_delete<duckdb::BoundLambdaExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundLambdaExpression,_std::default_delete<duckdb::BoundLambdaExpression>,_true>
                           *)&local_38);
    pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(this_00);
    (*(pEVar2->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_40,pEVar2);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar3->captures,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_40);
    if (local_40._M_head_impl != (Expression *)0x0) {
      (*((local_40._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_38.super__Head_base<0UL,_duckdb::BoundLambdaExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundLambdaExpression::Copy() const {
	auto copy = make_uniq<BoundLambdaExpression>(type, return_type, lambda_expr->Copy(), parameter_count);
	for (auto &capture : captures) {
		copy->captures.push_back(capture->Copy());
	}
	return std::move(copy);
}